

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

int CmpClass(void *p,void *va,void *vb)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  nodeclass **b;
  
  uVar5 = *(uint *)(*vb + 0x50);
  uVar1 = *(uint *)(*va + 0x50);
  if (uVar5 < uVar1) {
    iVar4 = 1;
  }
  else {
    if (uVar5 <= uVar1) {
      uVar2 = *(ulong *)(*va + 0x10);
      uVar3 = *(ulong *)(*vb + 0x10);
      uVar5 = 0;
      if (uVar2 != uVar3) {
        uVar5 = (uVar3 < uVar2) - 1 | 1;
      }
      return uVar5;
    }
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

static NOINLINE int CmpClass(const void* UNUSED_PARAM(p), const void* va, const void* vb)
{
    const nodeclass* const* a = va;
    const nodeclass* const* b = vb;
    fourcc_t AClass = NodeClass_ClassId(*a);
    fourcc_t BClass = NodeClass_ClassId(*b);
    if (AClass > BClass) return 1;
    if (AClass < BClass) return -1;
    if ((*a)->Module != (*b)->Module)
        return ((*a)->Module > (*b)->Module) ? 1:-1;
    return 0;
}